

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O2

_Bool float_isclose(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  double dVar1;
  double dVar2;
  gravity_fiber_t *fiber;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  gravity_value_t value;
  gravity_value_t gVar6;
  double local_1058;
  double local_1050;
  char _buffer [4096];
  
  if (nargs < 2) {
    aVar3.n = 1;
  }
  else {
    dVar1 = (args->field_1).f;
    gVar6 = convert_value2float(vm,args[1]);
    if (gVar6.isa == (gravity_class_t *)0x0) {
      builtin_strncpy(_buffer,"Unable to convert object to Float",0x22);
      fiber = gravity_vm_fiber(vm);
      gravity_fiber_seterror(fiber,_buffer);
      gVar6.field_1.n = 0;
      gVar6.isa = gravity_class_null;
      gravity_vm_setslot(vm,gVar6,rindex);
      return false;
    }
    if (nargs == 2) {
      local_1058 = 0.0;
      local_1050 = 1e-09;
    }
    else {
      if (args[2].isa == gravity_class_float) {
        uVar4 = (undefined4)args[2].field_1.n;
        uVar5 = (undefined4)((ulong)args[2].field_1.n >> 0x20);
      }
      else {
        uVar4 = 0xe826d695;
        uVar5 = 0x3e112e0b;
      }
      local_1050 = (double)CONCAT44(uVar5,uVar4);
      if ((nargs < 4) || (args[3].isa != gravity_class_float)) {
        uVar4 = 0;
        uVar5 = 0;
      }
      else {
        uVar4 = (undefined4)args[3].field_1.n;
        uVar5 = (undefined4)((ulong)args[3].field_1.n >> 0x20);
      }
      local_1058 = (double)CONCAT44(uVar5,uVar4);
    }
    dVar2 = fmax(ABS(dVar1),ABS((double)gVar6.field_1.n));
    dVar2 = fmax(dVar2 * local_1050,local_1058);
    aVar3.n._1_7_ = 0;
    aVar3.n._0_1_ = ABS(dVar1 - gVar6.field_1.f) <= dVar2;
  }
  value.field_1.n = aVar3.n;
  value.isa = gravity_class_bool;
  gravity_vm_setslot(vm,value,rindex);
  return true;
}

Assistant:

static bool float_isclose (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    if (nargs < 2) RETURN_VALUE(VALUE_FROM_BOOL(true), rindex);
    
    DECLARE_2VARIABLES(v1, v2, 0, 1);
    INTERNAL_CONVERT_FLOAT(v2, true);
    gravity_float_t rel_tol = 1e-09;
    gravity_float_t abs_tol=0.0;
    if (nargs > 2 && VALUE_ISA_FLOAT(GET_VALUE(2))) rel_tol = VALUE_AS_FLOAT(GET_VALUE(2));
    if (nargs > 3 && VALUE_ISA_FLOAT(GET_VALUE(3))) abs_tol = VALUE_AS_FLOAT(GET_VALUE(3));
    
    // abs(a-b) <= max(rel_tol * max(abs(a), abs(b)), abs_tol)
    
    #if GRAVITY_ENABLE_DOUBLE
    gravity_float_t abs_diff = fabs(v1.f - v2.f);
    gravity_float_t abs_a = fabs(v1.f);
    gravity_float_t abs_b = fabs(v2.f);
    gravity_float_t abs_max = fmax(abs_a, abs_b);
    gravity_float_t result = fmax(rel_tol * abs_max, abs_tol);
    #else
    gravity_float_t abs_diff = fabsf(v1.f - v2.f);
    gravity_float_t abs_a = fabsf(v1.f);
    gravity_float_t abs_b = fabsf(v2.f);
    gravity_float_t abs_max = fmaxf(abs_a, abs_b);
    gravity_float_t result = fmaxf(rel_tol * abs_max, abs_tol);
    #endif
    
    RETURN_VALUE(VALUE_FROM_BOOL(abs_diff <= result), rindex);
}